

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

int Js::VariableWalkerBase::GetReturnedValueCount(DiagStackFrame *frame)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DebugContext *this;
  ProbeContainer *this_00;
  ReturnedValueList *this_01;
  int local_1c;
  ReturnedValueList *returnedValueList;
  DiagStackFrame *frame_local;
  
  if (frame == (DiagStackFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x138,"(frame)","frame");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  iVar3 = (*frame->_vptr_DiagStackFrame[10])();
  if (CONCAT44(extraout_var,iVar3) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x139,"(frame->GetScriptContext())","frame->GetScriptContext()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  iVar3 = (*frame->_vptr_DiagStackFrame[10])();
  this = ScriptContext::GetDebugContext((ScriptContext *)CONCAT44(extraout_var_00,iVar3));
  this_00 = DebugContext::GetProbeContainer(this);
  this_01 = Js::ProbeContainer::GetReturnedValueList(this_00);
  if ((this_01 == (ReturnedValueList *)0x0) || (bVar2 = DiagStackFrame::IsTopFrame(frame), !bVar2))
  {
    local_1c = 0;
  }
  else {
    local_1c = JsUtil::ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>::Count
                         (&this_01->
                           super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>
                         );
  }
  return local_1c;
}

Assistant:

int  VariableWalkerBase::GetReturnedValueCount(DiagStackFrame* frame)
    {
        Assert(frame);
        Assert(frame->GetScriptContext());

        ReturnedValueList *returnedValueList = frame->GetScriptContext()->GetDebugContext()->GetProbeContainer()->GetReturnedValueList();
        return returnedValueList != nullptr && frame->IsTopFrame() ? returnedValueList->Count() : 0;
    }